

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

fdb_status
filemgr_read_dirty(filemgr *file,bid_t bid,void *buf,filemgr_dirty_update_node *node_reader,
                  filemgr_dirty_update_node *node_writer,err_log_callback *log_callback,
                  bool read_on_cache_miss)

{
  fdb_status fVar1;
  avl_node *paVar2;
  avl_node aStack_58;
  bid_t local_38;
  
  if (node_writer == (filemgr_dirty_update_node *)0x0) {
LAB_00116026:
    if (node_reader != (filemgr_dirty_update_node *)0x0) {
      local_38 = bid;
      paVar2 = avl_search(&node_reader->dirty_blocks,&aStack_58,_dirty_blocks_cmp);
      if (paVar2 != (avl_node *)0x0) goto LAB_0011604a;
    }
    fVar1 = filemgr_read(file,bid,buf,log_callback,read_on_cache_miss);
  }
  else {
    local_38 = bid;
    paVar2 = avl_search(&node_writer->dirty_blocks,&aStack_58,_dirty_blocks_cmp);
    if (paVar2 == (avl_node *)0x0) goto LAB_00116026;
LAB_0011604a:
    memcpy(buf,paVar2[1].parent,(ulong)file->blocksize);
    fVar1 = FDB_RESULT_SUCCESS;
  }
  return fVar1;
}

Assistant:

fdb_status filemgr_read_dirty(struct filemgr *file, bid_t bid, void *buf,
                              struct filemgr_dirty_update_node *node_reader,
                              struct filemgr_dirty_update_node *node_writer,
                              err_log_callback *log_callback,
                              bool read_on_cache_miss)
{
    struct avl_node *a;
    struct filemgr_dirty_update_block *block, query;

    if (node_writer) {
        // search the current (being written / mutable) dirty update first
        query.bid = bid;
        a = avl_search(&node_writer->dirty_blocks, &query.avl, _dirty_blocks_cmp);
        if (a) {
            // exist .. directly read the dirty block
            block = _get_entry(a, struct filemgr_dirty_update_block, avl);
            memcpy(buf, block->addr, file->blocksize);
            return FDB_RESULT_SUCCESS;
        }
        // not exist .. search the latest immutable dirty update next
    }

    if (node_reader) {
        query.bid = bid;
        a = avl_search(&node_reader->dirty_blocks, &query.avl, _dirty_blocks_cmp);
        if (a) {
            // exist .. directly read the dirty block
            block = _get_entry(a, struct filemgr_dirty_update_block, avl);
            memcpy(buf, block->addr, file->blocksize);
            return FDB_RESULT_SUCCESS;
        }
    }

    // not exist in both dirty update entries .. call filemgr_read()
    return filemgr_read(file, bid, buf, log_callback, read_on_cache_miss);
}